

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorWell::mousePressEvent(QColorWell *this,QMouseEvent *e)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_EDX;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  
  iVar1 = (this->super_QWellArray).selCol;
  (this->oldCurrent).xp = (Representation)(this->super_QWellArray).selRow;
  (this->oldCurrent).yp = (Representation)iVar1;
  QWellArray::mousePressEvent(&this->super_QWellArray,e);
  this->mousePressed = true;
  dVar5 = (double)QEventPoint::position();
  auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar7._8_8_ = (double)((ulong)dVar5 & 0x8000000000000000 | 0x3fe0000000000000) + dVar5;
  auVar7 = minpd(_DAT_0066f5d0,auVar7);
  auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
  auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
  uVar3 = movmskpd(extraout_EDX,auVar6);
  uVar4 = 0x8000000000000000;
  if ((uVar3 & 1) != 0) {
    uVar4 = (ulong)(uint)(int)auVar7._0_8_ << 0x20;
  }
  uVar2 = 0x80000000;
  if ((uVar3 & 2) != 0) {
    uVar2 = (ulong)(uint)(int)auVar7._8_8_;
  }
  this->pressPos = (QPoint)(uVar2 | uVar4);
  return;
}

Assistant:

void QColorWell::mousePressEvent(QMouseEvent *e)
{
    oldCurrent = QPoint(selectedRow(), selectedColumn());
    QWellArray::mousePressEvent(e);
    mousePressed = true;
    pressPos = e->position().toPoint();
}